

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.hpp
# Opt level: O2

string_t duckdb::UncompressedStringStorage::FetchStringFromDict
                   (ColumnSegment *segment,uint32_t dict_end_offset,Vector *result,
                   data_ptr_t base_ptr,int32_t dict_offset,uint32_t string_length)

{
  data_ptr_t __src;
  string_t sVar1;
  uint32_t local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 local_c;
  
  if (dict_offset < 0) {
    sVar1 = ReadOverflowString(segment,result,
                               *(block_id_t *)
                                (base_ptr + ((ulong)dict_end_offset - (ulong)(uint)-dict_offset)),
                               (int32_t)*(block_id_t *)
                                         ((long)(base_ptr +
                                                ((ulong)dict_end_offset - (ulong)(uint)-dict_offset)
                                                ) + 8));
    __src = sVar1.value._8_8_;
    local_18 = sVar1.value._0_4_;
    uStack_14 = sVar1.value._4_4_;
  }
  else {
    __src = base_ptr + ((ulong)dict_end_offset - (ulong)(uint)dict_offset);
    local_18 = string_length;
    if (string_length < 0xd) {
      local_c = 0;
      uStack_14 = 0;
      uStack_10 = 0;
      if (string_length == 0) {
        __src = (data_ptr_t)0x0;
      }
      else {
        switchD_00916250::default(&uStack_14,__src,(ulong)string_length);
        __src = (data_ptr_t)CONCAT44(local_c,uStack_10);
      }
    }
    else {
      uStack_14 = *(undefined4 *)__src;
    }
  }
  sVar1.value._4_1_ = (undefined1)uStack_14;
  sVar1.value._5_1_ = uStack_14._1_1_;
  sVar1.value._6_1_ = uStack_14._2_1_;
  sVar1.value._7_1_ = uStack_14._3_1_;
  sVar1.value.pointer.length = local_18;
  sVar1.value.pointer.ptr = (char *)__src;
  return (string_t)sVar1.value;
}

Assistant:

inline static string_t FetchStringFromDict(ColumnSegment &segment, uint32_t dict_end_offset, Vector &result,
	                                           data_ptr_t base_ptr, int32_t dict_offset, uint32_t string_length) {
		D_ASSERT(dict_offset <= NumericCast<int32_t>(segment.GetBlockManager().GetBlockSize()));
		if (DUCKDB_LIKELY(dict_offset >= 0)) {
			// regular string - fetch from dictionary
			auto dict_end = base_ptr + dict_end_offset;
			auto dict_pos = dict_end - dict_offset;

			auto str_ptr = char_ptr_cast(dict_pos);
			return string_t(str_ptr, string_length);
		} else {
			// read overflow string
			block_id_t block_id;
			int32_t offset;
			ReadStringMarker(base_ptr + dict_end_offset - AbsValue<int32_t>(dict_offset), block_id, offset);

			return ReadOverflowString(segment, result, block_id, offset);
		}
	}